

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void player_generate(player *p,player_race *r,player_class *c,_Bool old_history)

{
  char *pcVar1;
  int local_28;
  wchar_t i;
  _Bool old_history_local;
  player_class *c_local;
  player_race *r_local;
  player *p_local;
  
  _i = c;
  if (c == (player_class *)0x0) {
    _i = p->class;
  }
  c_local = (player_class *)r;
  if (r == (player_race *)0x0) {
    c_local = (player_class *)p->race;
  }
  p->class = _i;
  p->race = (player_race *)c_local;
  get_level(p);
  p->hitdie = (char)p->race->r_mhp + (char)p->class->c_mhp;
  p->player_hp[0] = (ushort)p->hitdie;
  for (local_28 = 1; local_28 < p->lev; local_28 = local_28 + 1) {
    p->player_hp[local_28] = p->player_hp[local_28 + -1] + (ushort)p->hitdie;
  }
  p->mhp = p->player_hp[p->lev + -1];
  get_ahw(p);
  p->timed[10] = (short)PY_FOOD_FULL + -1;
  if (!old_history) {
    if (p->history != (char *)0x0) {
      string_free(p->history);
    }
    pcVar1 = get_history(p->race->history);
    p->history = pcVar1;
  }
  return;
}

Assistant:

void player_generate(struct player *p, const struct player_race *r,
					 const struct player_class *c, bool old_history)
{
	int i;

	if (!c)
		c = p->class;
	if (!r)
		r = p->race;

	p->class = c;
	p->race = r;

	/* Set the level */
	get_level(p);

	/* Hitdice */
	p->hitdie = p->race->r_mhp + p->class->c_mhp;

	/* Pre-calculate level 1 hitdice */
	p->player_hp[0] = p->hitdie;

	/*
	 * Fill in overestimates of hitpoints for additional levels.  Do not
	 * do the actual rolls so the player can not reset the birth screen
	 * to get a desirable set of initial rolls.
	 */
	for (i = 1; i < p->lev; i++) {
		p->player_hp[i] = p->player_hp[i - 1] + p->hitdie;
	}

	/* Initial hitpoints */
	p->mhp = p->player_hp[p->lev - 1];

	/* Roll for age/height/weight */
	get_ahw(p);

	/* Always start with a well fed player */
	p->timed[TMD_FOOD] = PY_FOOD_FULL - 1;

	if (!old_history) {
		if (p->history) {
			string_free(p->history);
		}
		p->history = get_history(p->race->history);
	}
}